

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2199::ByteSwap<double>::Run(ByteSwap<double> *this,istream *input_stream)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined1 *puVar5;
  long lVar6;
  int address;
  int iVar7;
  uchar tmp;
  double data;
  uchar local_39;
  undefined8 local_38;
  
  iVar7 = this->start_address_ + this->start_offset_ * 8;
  if (input_stream == (istream *)&std::cin) {
    if (0 < iVar7) {
      iVar4 = this->start_address_ + this->start_offset_ * 8;
      do {
        iVar4 = iVar4 + -1;
        bVar2 = sptk::ReadStream<unsigned_char>(&local_39,(istream *)&std::cin);
        if (!bVar2) break;
      } while (iVar4 != 0);
    }
  }
  else {
    std::istream::seekg(input_stream,(long)iVar7,0);
  }
  iVar4 = std::istream::peek();
  if ((iVar4 == -1) ||
     (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 5) != 0)) {
LAB_001058df:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (this->end_address_ == -1 || iVar7 <= this->end_address_) {
      iVar4 = this->start_offset_;
      do {
        if ((this->end_offset_ != -1) && (this->end_offset_ < iVar4)) {
          return true;
        }
        bVar3 = sptk::ReadStream<double>((double *)&local_38,input_stream);
        if (!bVar3) {
          return true;
        }
        puVar5 = (undefined1 *)((long)&local_38 + 7);
        lVar6 = 0;
        do {
          uVar1 = *(undefined1 *)((long)&local_38 + lVar6);
          *(undefined1 *)((long)&local_38 + lVar6) = *puVar5;
          *puVar5 = uVar1;
          lVar6 = lVar6 + 1;
          puVar5 = puVar5 + -1;
        } while (lVar6 != 4);
        bVar3 = sptk::WriteStream<double>(local_38,(ostream *)&std::cout);
        if (!bVar3) goto LAB_001058df;
        iVar7 = iVar7 + 8;
        iVar4 = iVar4 + 1;
      } while ((this->end_address_ == -1) || (iVar7 <= this->end_address_));
    }
  }
  return bVar2;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    // Skip data.
    const int data_size(static_cast<int>(sizeof(T)));
    const int skip_size(start_address_ + data_size * start_offset_);
    if (&std::cin == input_stream) {
      unsigned char tmp;
      int i(0);
      while (i < skip_size && sptk::ReadStream(&tmp, input_stream)) {
        ++i;
      }
    } else {
      input_stream->seekg(skip_size);
    }
    const int c(input_stream->peek());
    if (EOF == c || input_stream->fail()) {
      return false;
    }

    // Swap data.
    T data;
    for (int address(skip_size), offset(start_offset_);
         (kMagicNumberForEnd == end_address_ || address <= end_address_) &&
         (kMagicNumberForEnd == end_offset_ || offset <= end_offset_) &&
         sptk::ReadStream(&data, input_stream);
         address += data_size, ++offset) {
      unsigned char* p(reinterpret_cast<unsigned char*>(&data));
      std::reverse(p, p + data_size);
      if (!sptk::WriteStream(data, &std::cout)) {
        return false;
      }
    }

    return true;
  }